

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O1

ssize_t __thiscall
lrit::HeaderReader<lrit::HeaderStructureRecordHeader>::read
          (HeaderReader<lrit::HeaderStructureRecordHeader> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  pointer puVar1;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *local_48 [2];
  long local_38 [2];
  
  puVar1 = (this->b_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + this->p_;
  local_48[0] = local_38;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)local_48,puVar1,(pointer)((long)__buf + (long)puVar1));
  sVar2 = std::__cxx11::string::operator=
                    ((string *)CONCAT44(in_register_00000034,__fd),(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
    sVar2 = extraout_RAX;
  }
  this->p_ = this->p_ + (int)__buf;
  return sVar2;
}

Assistant:

void read(std::string& dst, size_t len) {
    auto a = b_.begin() + p_;
    auto b = b_.begin() + p_ + len;
    dst = std::string(a, b);
    p_ += len;
  }